

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

size_t intersection_uint32_card(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB)

{
  uint32_t *endB;
  uint32_t *endA;
  size_t card;
  size_t lenB_local;
  uint32_t *B_local;
  size_t lenA_local;
  uint32_t *A_local;
  size_t local_8;
  
  if ((lenA == 0) || (lenB == 0)) {
    local_8 = 0;
  }
  else {
    card = 0;
    B_local = B;
    A_local = A;
    do {
      while (*B_local <= *A_local) {
        while (*B_local < *A_local) {
          B_local = B_local + 1;
          if (B_local == B + lenB) {
            return card;
          }
        }
        if (*A_local != *B_local) break;
        card = card + 1;
        A_local = A_local + 1;
        if (A_local == A + lenA) {
          return card;
        }
        B_local = B_local + 1;
        if (B_local == B + lenB) {
          return card;
        }
      }
      A_local = A_local + 1;
    } while (A_local != A + lenA);
    local_8 = card;
  }
  return local_8;
}

Assistant:

size_t intersection_uint32_card(const uint32_t *A, const size_t lenA,
                                const uint32_t *B, const size_t lenB) {
    if (lenA == 0 || lenB == 0) return 0;
    size_t card = 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return card;
        }
        while (*A > *B) {
            if (++B == endB) return card;
        }
        if (*A == *B) {
            card++;
            if (++A == endA || ++B == endB) return card;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return card;  // NOTREACHED
}